

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall
sf::Shader::loadFromFile(Shader *this,string *vertexShaderFilename,string *fragmentShaderFilename)

{
  bool bVar1;
  ostream *poVar2;
  reference vertexShaderCode;
  reference fragmentShaderCode;
  undefined1 local_68 [8];
  vector<char,_std::allocator<char>_> fragmentShader;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> vertexShader;
  string *fragmentShaderFilename_local;
  string *vertexShaderFilename_local;
  Shader *this_local;
  
  vertexShader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       fragmentShaderFilename;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_40);
  bVar1 = anon_unknown.dwarf_ca316::getFileContents
                    (vertexShaderFilename,(vector<char,_std::allocator<char>_> *)local_40);
  if (bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_68);
    bVar1 = anon_unknown.dwarf_ca316::getFileContents
                      ((string *)
                       vertexShader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                       (vector<char,_std::allocator<char>_> *)local_68);
    if (bVar1) {
      vertexShaderCode =
           std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,0);
      fragmentShaderCode =
           std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_68,0);
      this_local._7_1_ = compile(this,vertexShaderCode,(char *)0x0,fragmentShaderCode);
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to open fragment shader file \"");
      poVar2 = std::operator<<(poVar2,(string *)
                                      vertexShader.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl._16_8_);
      poVar2 = std::operator<<(poVar2,"\"");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    fragmentShader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_68);
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to open vertex shader file \"");
    poVar2 = std::operator<<(poVar2,(string *)vertexShaderFilename);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
    fragmentShader.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return this_local._7_1_;
}

Assistant:

bool Shader::loadFromFile(const std::string& vertexShaderFilename, const std::string& fragmentShaderFilename)
{
    // Read the vertex shader file
    std::vector<char> vertexShader;
    if (!getFileContents(vertexShaderFilename, vertexShader))
    {
        err() << "Failed to open vertex shader file \"" << vertexShaderFilename << "\"" << std::endl;
        return false;
    }

    // Read the fragment shader file
    std::vector<char> fragmentShader;
    if (!getFileContents(fragmentShaderFilename, fragmentShader))
    {
        err() << "Failed to open fragment shader file \"" << fragmentShaderFilename << "\"" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], NULL, &fragmentShader[0]);
}